

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O0

void __thiscall FxConstant::FxConstant(FxConstant *this,bool val,FScriptPosition *pos)

{
  PBool *pPVar1;
  FScriptPosition *pos_local;
  bool val_local;
  FxConstant *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00a0ba60;
  ExpVal::ExpVal(&this->value);
  pPVar1 = TypeBool;
  (this->value).Type = (PType *)TypeBool;
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  *(uint *)&(this->value).field_1 = (uint)val;
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(bool val, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = TypeBool;
		value.Int = val;
		isresolved = true;
	}